

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr t;
  SQObjectPtr *self;
  
  if (v->_top - v->_stackbase < 2) {
    SQVM::Raise_Error(v,"not enough params in the stack");
  }
  else {
    bVar1 = sq_aux_gettypedarg(v,idx,OT_TABLE,&self);
    if (bVar1) {
      pSVar2 = SQVM::GetUp(v,-1);
      t.super_SQObject._type = OT_NULL;
      t.super_SQObject._unVal.pTable = (SQTable *)0x0;
      bVar1 = SQTable::Get((self->super_SQObject)._unVal.pTable,pSVar2,&t);
      if (bVar1) {
        SQTable::Remove((self->super_SQObject)._unVal.pTable,pSVar2);
      }
      if (pushval == 0) {
        SQVM::Pop(v);
      }
      else {
        pSVar2 = SQVM::GetUp(v,-1);
        SQObjectPtr::operator=(pSVar2,&t);
      }
      SQObjectPtr::~SQObjectPtr(&t);
      return 0;
    }
  }
  return -1;
}

Assistant:

SQRESULT sq_rawdeleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 2);
    SQObjectPtr *self;
    _GETSAFE_OBJ(v, idx, OT_TABLE,self);
    SQObjectPtr &key = v->GetUp(-1);
    SQObjectPtr t;
    if(_table(*self)->Get(key,t)) {
        _table(*self)->Remove(key);
    }
    if(pushval != 0)
        v->GetUp(-1) = t;
    else
        v->Pop();
    return SQ_OK;
}